

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commodities.cpp
# Opt level: O2

string * units::getCommodityName_abi_cxx11_(uint32_t commodity)

{
  iterator iVar1;
  const_iterator cVar2;
  uint in_ESI;
  char cVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  uint local_78;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_78 = in_ESI;
  if ((((_ZN5unitsL22allowCustomCommoditiesE_0 & 1) != 0) &&
      (customCommodityNames_abi_cxx11_._24_8_ != 0)) &&
     (iVar1 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)customCommodityNames_abi_cxx11_,&local_78),
     iVar1.
     super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
     ._M_cur != (__node_type *)0x0)) {
    std::__cxx11::string::string
              ((string *)in_RDI,
               (string *)
               ((long)iVar1.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                      ._M_cur + 0x10));
    return in_RDI;
  }
  cVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_char_*>,_std::allocator<std::pair<const_unsigned_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_char_*>,_std::allocator<std::pair<const_unsigned_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)commodities::commodity_names,&local_78);
  if (cVar2.super__Node_iterator_base<std::pair<const_unsigned_int,_const_char_*>,_false>._M_cur ==
      (__node_type *)0x0) {
    if ((local_78 & 0x7c000000) == 0x40000000) {
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      in_RDI->_M_string_length = 0;
      (in_RDI->field_2)._M_local_buf[0] = '\0';
      cVar3 = (char)in_RDI;
      std::__cxx11::string::push_back(cVar3);
      std::__cxx11::string::push_back(cVar3);
      std::__cxx11::string::push_back(cVar3);
      std::__cxx11::string::push_back(cVar3);
      std::__cxx11::string::push_back(cVar3);
      while ((in_RDI->_M_string_length != 0 &&
             ((in_RDI->_M_dataplus)._M_p[in_RDI->_M_string_length - 1] == '_'))) {
        std::__cxx11::string::pop_back();
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_30,"CXCOMM[",&local_71);
      std::__cxx11::to_string(&local_50,local_78);
      std::operator+(&local_70,&local_30,&local_50);
      std::operator+(in_RDI,&local_70,"]");
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)in_RDI,
               *(char **)((long)cVar2.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_const_char_*>,_false>
                                ._M_cur + 0x10),(allocator *)&local_70);
  }
  return in_RDI;
}

Assistant:

std::string getCommodityName(std::uint32_t commodity)
{
    if (allowCustomCommodities.load(std::memory_order_acquire)) {
        if (!customCommodityNames.empty()) {
            auto fnd2 = customCommodityNames.find(commodity);
            if (fnd2 != customCommodityNames.end()) {
                return fnd2->second;
            }
        }
    }
    auto fnd = commodities::commodity_names.find(commodity);
    if (fnd != commodities::commodity_names.end()) {
        return fnd->second;
    }

    if ((commodity & 0x7C000000U) == 0x40000000U) {
        std::string ret;
        ret.push_back((commodity & 0X1FU) + '_');
        ret.push_back(((commodity >> 5U) & 0X1FU) + '_');
        ret.push_back(((commodity >> 10U) & 0X1FU) + '_');
        ret.push_back(((commodity >> 15U) & 0X1FU) + '_');
        ret.push_back(((commodity >> 20U) & 0X1FU) + '_');
        while (!ret.empty() && ret.back() == '_') {
            ret.pop_back();
        }
        return ret;
    }
    return std::string("CXCOMM[") + std::to_string(commodity) + "]";
}